

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::set_data
          (section_impl<ELFIO::Elf64_Shdr> *this,char *raw_data,Elf_Xword size)

{
  char *__dest;
  int iVar1;
  tuple<char_*,_std::default_delete<char[]>_> in_RAX;
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_28;
  
  local_28._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       in_RAX.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  iVar1 = (*(this->super_section)._vptr_section[5])();
  if (iVar1 != 8) {
    __p_00 = (pointer)operator_new__(size,(nothrow_t *)&std::nothrow);
    local_28._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_std::default_delete<char[]>_>)
         (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
    std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->data,__p_00);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_28);
    __dest = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (raw_data == (char *)0x0 || __dest == (char *)0x0) {
      this->data_size = 0;
    }
    else {
      this->data_size = size;
      if (size != 0) {
        memmove(__dest,raw_data,size);
      }
    }
  }
  (*(this->super_section)._vptr_section[0x14])(this,&this->data_size);
  if ((this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (*(this->super_section)._vptr_section[0x21])(this,this->data_size);
  }
  return;
}

Assistant:

void set_data( const char* raw_data, Elf_Xword size ) override
    {
        if ( get_type() != SHT_NOBITS ) {
            data = std::unique_ptr<char[]>( new ( std::nothrow ) char[(size_t)size] );
            if ( nullptr != data.get() && nullptr != raw_data ) {
                data_size = size;
                std::copy( raw_data, raw_data + size, data.get() );
            }
            else {
                data_size = 0;
            }
        }

        set_size( data_size );
        if ( translator->empty() ) {
            set_stream_size( (size_t)data_size );
        }
    }